

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

string * get_yandex_oauth_token_abi_cxx11_(void)

{
  future_status fVar1;
  string *in_RDI;
  thread server_thread;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ftr;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  promiseToken;
  Server server;
  thread local_190;
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  Server local_138;
  
  httplib::Server::Server(&local_138);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  promise(&local_178);
  std::
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  __basic_future(&local_188,&local_178._M_future);
  local_160._M_dataplus._M_p = (pointer)&local_138;
  local_140 = &local_178;
  std::thread::
  thread<void(&)(httplib::Server*,std::promise<std::__cxx11::string>*),httplib::Server*,std::promise<std::__cxx11::string>*,void>
            (&local_190,_listen_server,(Server **)&local_160,&local_140);
  system(
        "xdg-open https://oauth.yandex.ru/authorize?client_id=bc2f272cc37349b7a1320b9ac7826ebf\\&response_type=token"
        );
  local_160._M_dataplus._M_p = (pointer)0x14;
  fVar1 = std::__basic_future<std::__cxx11::string>::wait_for<long,std::ratio<1l,1l>>
                    ((__basic_future<std::__cxx11::string> *)&local_188,
                     (duration<long,_std::ratio<1L,_1L>_> *)&local_160);
  if (fVar1 == ready) {
    std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    get(&local_160,
        (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_188);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  httplib::Server::stop(&local_138);
  std::thread::join();
  std::thread::~thread(&local_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~promise(&local_178);
  httplib::Server::~Server(&local_138);
  return in_RDI;
}

Assistant:

std::string get_yandex_oauth_token()
{
    httplib::Server server;
    std::string token;

    std::promise<std::string> promiseToken;
    std::future<std::string> ftr = promiseToken.get_future();

    //create and run server on separate thread
    std::thread server_thread(_listen_server, &server, &promiseToken);

    //TODO add win32 browser open
    system("xdg-open https://oauth.yandex.ru/authorize?client_id=bc2f272cc37349b7a1320b9ac7826ebf\\&response_type=token");

    try{
        std::future_status ftr_status = ftr.wait_for(std::chrono::seconds(20));
        if(ftr_status == std::future_status::ready) {
            token = ftr.get();
        } else if (ftr_status == std::future_status::timeout){
            //std::cout << "Timeout!!! token is unknown\n";
        } else {
            //std::cout << "Future status = deffered\n";
        }

    } catch(std::exception & e) {
        //std::cout << e.what() << std::endl;
    }

    server.stop();
    server_thread.join();

    return token;
}